

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O2

RDL_cfURF * RDL_findCycleFams(RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  RDL_cfURF *__ptr;
  void *__ptr_00;
  RDL_cfam *pRVar7;
  char *pcVar8;
  RDL_cfam **__base;
  uint from;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint r;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint local_bc;
  RDL_cfam **local_98;
  RDL_cfam **local_88;
  RDL_cfam **local_70;
  uint local_5c;
  RDL_cfam **local_58;
  ulong local_50;
  RDL_cfam **local_48;
  
  __ptr = (RDL_cfURF *)malloc(0x10);
  __ptr->alloced = 0x40;
  local_98 = (RDL_cfam **)malloc(0x200);
  __ptr->fams = local_98;
  __ptr->nofFams = 0;
  uVar11 = (ulong)gra->V;
  __ptr_00 = malloc(uVar11 << 2);
  local_50 = 0x40;
  uVar10 = 0;
  uVar5 = 0;
  local_bc = 0;
  local_88 = local_98;
  local_70 = local_98;
  local_58 = local_98;
  local_48 = local_98;
  for (uVar9 = 0; uVar9 < uVar11; uVar9 = uVar9 + 1) {
    for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
      if (spi->reachable[uVar9][uVar13] == '\x01') {
        uVar11 = 0;
        uVar14 = 0;
        while( true ) {
          uVar1 = gra->degree[uVar13];
          from = (uint)uVar13;
          r = (uint)uVar9;
          if (uVar1 <= uVar11) break;
          uVar2 = gra->adjList[uVar13][uVar11][0];
          uVar12 = (ulong)uVar2;
          if (spi->reachable[uVar9][uVar12] == '\x01') {
            uVar3 = spi->dist[uVar9][uVar12];
            uVar4 = spi->dist[uVar9][uVar13];
            if (uVar3 + 1 == uVar4) {
              *(uint *)((long)__ptr_00 + uVar14 * 4) = uVar2;
              uVar14 = (ulong)((int)uVar14 + 1);
            }
            else if ((uVar3 != uVar4 + 1) &&
                    (((uVar3 = gra->degree[uVar12], uVar3 < uVar1 ||
                      (uVar12 < uVar13 && uVar3 == uVar1)) &&
                     (iVar6 = RDL_pathsShareOnlyStart(r,from,uVar2,gra,spi), iVar6 != 0)))) {
              if ((uint)local_50 == uVar10) {
                local_50 = (ulong)(uVar10 * 2);
                __ptr->alloced = uVar10 * 2;
                local_88 = (RDL_cfam **)realloc(local_88,local_50 * 8);
                __ptr->fams = local_88;
                local_48 = local_88;
              }
              if (local_88 == (RDL_cfam **)0x0) {
                local_88 = (RDL_cfam **)0x0;
                local_58 = (RDL_cfam **)0x0;
                local_98 = (RDL_cfam **)0x0;
                local_70 = (RDL_cfam **)0x0;
                local_bc = uVar10;
                uVar5 = uVar10;
              }
              else {
                pRVar7 = (RDL_cfam *)malloc(0x28);
                pRVar7->r = r;
                pRVar7->p = from;
                pRVar7->q = uVar2;
                pRVar7->x = 0xffffffff;
                pRVar7->mark = 0;
                pcVar8 = RDL_findPrototype(r,from,uVar2,0xffffffff,gra,spi);
                pRVar7->prototype = pcVar8;
                pRVar7->weight = spi->dist[uVar9][uVar13] + 1 + spi->dist[uVar9][uVar12];
                local_bc = uVar10 + 1;
                __ptr->nofFams = local_bc;
                local_48[uVar10] = pRVar7;
                local_88 = local_48;
                local_58 = local_48;
                local_98 = local_48;
                local_70 = local_48;
                uVar10 = local_bc;
                uVar5 = local_bc;
              }
            }
            if (spi->dist[uVar9][uVar12] == 1) {
              RDL_addEdge(spi->dPaths[uVar9],uVar2,r);
            }
          }
          uVar11 = uVar11 + 1;
        }
        local_5c = 1;
        for (uVar11 = 0; uVar11 != uVar14; uVar11 = uVar11 + 1) {
          uVar1 = *(uint *)((long)__ptr_00 + uVar11 * 4);
          for (uVar12 = (ulong)local_5c; uVar12 < uVar14; uVar12 = uVar12 + 1) {
            uVar2 = *(uint *)((long)__ptr_00 + uVar12 * 4);
            iVar6 = RDL_pathsShareOnlyStart(r,uVar1,uVar2,gra,spi);
            if (iVar6 != 0) {
              if ((uint)local_50 == uVar5) {
                local_50 = (ulong)(uVar5 * 2);
                __ptr->alloced = uVar5 * 2;
                local_98 = (RDL_cfam **)realloc(local_98,local_50 * 8);
                __ptr->fams = local_98;
                local_88 = local_98;
                local_58 = local_98;
                local_48 = local_98;
              }
              if (local_98 == (RDL_cfam **)0x0) {
                local_98 = (RDL_cfam **)0x0;
                local_70 = (RDL_cfam **)0x0;
                local_bc = uVar5;
              }
              else {
                pRVar7 = (RDL_cfam *)malloc(0x28);
                pRVar7->r = r;
                pRVar7->p = uVar1;
                pRVar7->q = uVar2;
                pRVar7->x = from;
                pRVar7->mark = 0;
                pcVar8 = RDL_findPrototype(r,uVar1,uVar2,from,gra,spi);
                pRVar7->prototype = pcVar8;
                pRVar7->weight = spi->dist[uVar9][uVar1] + 2 + spi->dist[uVar9][uVar2];
                uVar10 = uVar5 + 1;
                __ptr->nofFams = uVar10;
                local_58[uVar5] = pRVar7;
                local_98 = local_58;
                local_70 = local_58;
                local_bc = uVar10;
                uVar5 = uVar10;
              }
            }
          }
          local_5c = local_5c + 1;
        }
        for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
          RDL_addEdge(spi->dPaths[uVar9],from,*(uint *)((long)__ptr_00 + uVar11 * 4));
        }
        uVar11 = (ulong)gra->V;
      }
    }
  }
  free(__ptr_00);
  if (local_70 == (RDL_cfam **)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"Graph is too large, can\'t allocate memory!\n");
    free(__ptr);
    __ptr = (RDL_cfURF *)0x0;
  }
  else {
    __ptr->alloced = local_bc;
    __base = (RDL_cfam **)realloc(local_70,(ulong)local_bc * 8);
    __ptr->fams = __base;
    qsort(__base,(ulong)local_bc,8,RDL_cycleFamsComp);
  }
  return __ptr;
}

Assistant:

RDL_cfURF *RDL_findCycleFams(RDL_graph *gra, RDL_sPathInfo *spi)
{
  RDL_cfURF *rc = malloc(sizeof(*rc));
  /*number of CFs is at most 2m^2+vn (Vismara Lemma 3)*/

  rc->alloced = 64;
  rc->fams = malloc(rc->alloced * sizeof(*rc->fams));
  rc->nofFams = 0;
  RDL_vismara(rc, gra, spi);

  if (!rc->fams) {
    RDL_outputFunc(RDL_ERROR, "Graph is too large, can't allocate memory!\n");
    free(rc);
    return NULL;
  }

  rc->alloced = rc->nofFams;
  rc->fams = realloc(rc->fams, rc->alloced * sizeof(*rc->fams));

  /* sort by size */
  qsort(rc->fams, rc->nofFams, sizeof(*rc->fams), RDL_cycleFamsComp);
  return rc;
}